

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPU.cpp
# Opt level: O3

void __thiscall PPU::fetchLowTileByte(PPU *this)

{
  uint uVar1;
  uint8_t uVar2;
  
  uVar1._0_1_ = this->PPUCTRL;
  uVar1._1_1_ = this->PPUMASK;
  uVar1._2_1_ = this->PPUSTATUS;
  uVar1._3_1_ = this->OAMADDR;
  uVar2 = ROM::ReadCHR(this->rom,
                       (ushort)this->nameTableByte << 4 | (ushort)((uVar1 & 0x10) << 8) |
                       this->vramCur >> 0xc & 7);
  this->lowTileByte = uVar2;
  return;
}

Assistant:

void PPU::fetchLowTileByte() {
    uint8_t fineY = ((vramCur >> 12) & 7);
    uint8_t table = (PPUCTRL & flagBackgroundTable) ? 1 : 0;
    uint8_t tile = nameTableByte;
    uint16_t addr = (0x1000 * table) + (tile * 0x10) + fineY;
    lowTileByte = ReadRam(addr);
}